

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O1

bool __thiscall glu::ES2ContextInfo::isVertexUniformLoopSupported(ES2ContextInfo *this)

{
  bool bVar1;
  
  if ((this->m_vertexUniformLoopsSupported).m_isComputed == false) {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_vertexUniformLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_vertexUniformLoopsSupported).m_value = bVar1;
    (this->m_vertexUniformLoopsSupported).m_isComputed = true;
  }
  return (this->m_vertexUniformLoopsSupported).m_value;
}

Assistant:

bool								isVertexUniformLoopSupported		(void) const	{ return m_vertexUniformLoopsSupported.getValue(m_context);		}